

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCut.c
# Opt level: O0

void Map_MappingCutsInput(Map_Man_t *p,Map_Node_t *pNode)

{
  int iVar1;
  Map_Cut_t *pMVar2;
  Map_Cut_t *pCut;
  Map_Node_t *pNode_local;
  Map_Man_t *p_local;
  
  iVar1 = Map_NodeIsVar(pNode);
  if (iVar1 == 0) {
    iVar1 = Map_NodeIsBuf(pNode);
    if (iVar1 == 0) {
      __assert_fail("Map_NodeIsVar(pNode) || Map_NodeIsBuf(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCut.c"
                    ,0xa1,"void Map_MappingCutsInput(Map_Man_t *, Map_Node_t *)");
    }
  }
  pMVar2 = Map_CutAlloc(p);
  pMVar2->nLeaves = '\x01';
  pMVar2->ppLeaves[0] = pNode;
  pNode->pCuts = pMVar2;
  pNode->pCutBest[0] = (Map_Cut_t *)0x0;
  pNode->pCutBest[1] = pMVar2;
  pMVar2->uTruth = 0xaaaaaaaa;
  pMVar2->M[0].AreaFlow = 0.0;
  pMVar2->M[1].AreaFlow = 0.0;
  return;
}

Assistant:

void Map_MappingCutsInput( Map_Man_t * p, Map_Node_t * pNode )
{
    Map_Cut_t * pCut;
    assert( Map_NodeIsVar(pNode) || Map_NodeIsBuf(pNode) );
    pCut = Map_CutAlloc( p );
    pCut->nLeaves = 1;
    pCut->ppLeaves[0] = pNode;
    pNode->pCuts   = pCut;
    pNode->pCutBest[0] = NULL; // negative polarity is not mapped
    pNode->pCutBest[1] = pCut; // positive polarity is a trivial cut
    pCut->uTruth = 0xAAAAAAAA; // the first variable "1010"
    pCut->M[0].AreaFlow = 0.0;
    pCut->M[1].AreaFlow = 0.0;
}